

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::constructKalmanFilter
          (DiscreteKalmanFilterHelper *this,MatrixDynSize *A,MatrixDynSize *B,MatrixDynSize *C,
          MatrixDynSize *D)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  MatrixDynSize *in_RCX;
  MatrixDynSize *in_RDX;
  MatrixDynSize *in_RSI;
  ulong *in_RDI;
  MatrixDynSize *in_R8;
  
  lVar1 = iDynTree::MatrixDynSize::rows();
  lVar2 = iDynTree::MatrixDynSize::cols();
  if (lVar1 != lVar2) {
    iDynTree::reportError
              ("DiscreteKalmanFilterHelper","constructKalmanFilter",
               "Could not construct KF - ill-formed state transition matrix A, exiting.");
    return false;
  }
  uVar3 = iDynTree::MatrixDynSize::rows();
  *in_RDI = uVar3;
  iDynTree::MatrixDynSize::resize((ulong)(in_RDI + 0x13),*in_RDI);
  iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 0x13),in_RSI);
  iDynTree::MatrixDynSize::resize((ulong)(in_RDI + 0x27),*in_RDI);
  iDynTree::MatrixDynSize::zero();
  iDynTree::MatrixDynSize::resize((ulong)(in_RDI + 0x31),*in_RDI);
  iDynTree::MatrixDynSize::zero();
  lVar1 = iDynTree::MatrixDynSize::capacity();
  if (lVar1 == 0) {
    *(undefined1 *)((long)in_RDI + 0x1e1) = 0;
  }
  else {
    lVar1 = iDynTree::MatrixDynSize::rows();
    lVar2 = iDynTree::MatrixDynSize::rows();
    if (lVar1 != lVar2) {
      iDynTree::reportError
                ("DiscreteKalmanFilterHelper","constructKalmanFilter",
                 "Could not construct KF -  control input matrix B dimension mismatch, exiting.");
      return false;
    }
    *(undefined1 *)((long)in_RDI + 0x1e1) = 1;
    iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 0x18),in_RDX);
  }
  uVar3 = iDynTree::MatrixDynSize::cols();
  in_RDI[2] = uVar3;
  iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0xb));
  iDynTree::VectorDynSize::zero();
  lVar1 = iDynTree::MatrixDynSize::capacity();
  if (lVar1 != 0) {
    lVar1 = iDynTree::MatrixDynSize::cols();
    lVar2 = iDynTree::MatrixDynSize::rows();
    if (lVar1 == lVar2) {
      uVar3 = iDynTree::MatrixDynSize::rows();
      in_RDI[1] = uVar3;
      iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 0x1d),in_RCX);
      iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0xf));
      iDynTree::VectorDynSize::zero();
      iDynTree::MatrixDynSize::resize((ulong)(in_RDI + 0x36),in_RDI[1]);
      iDynTree::MatrixDynSize::zero();
      lVar1 = iDynTree::MatrixDynSize::capacity();
      if (lVar1 == 0) {
        *(undefined1 *)(in_RDI + 0x3c) = 0;
LAB_00640504:
        *(undefined1 *)((long)in_RDI + 0x1d9) = 1;
        return true;
      }
      lVar1 = iDynTree::MatrixDynSize::rows();
      lVar2 = iDynTree::MatrixDynSize::rows();
      if (lVar1 == lVar2) {
        lVar1 = iDynTree::MatrixDynSize::cols();
        lVar2 = iDynTree::MatrixDynSize::rows();
        if (lVar1 == lVar2) {
          *(undefined1 *)(in_RDI + 0x3c) = 1;
          iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 0x22),in_R8);
          goto LAB_00640504;
        }
      }
      iDynTree::reportError
                ("DiscreteKalmanFilterHelper","constructKalmanFilter",
                 "Could not construct KF -  control feedthrough matrix D dimension mismatch, exiting."
                );
      return false;
    }
  }
  iDynTree::reportError
            ("DiscreteKalmanFilterHelper","constructKalmanFilter",
             "Could not construct KF -  output matrix C dimension mismatch, exiting.");
  return false;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::constructKalmanFilter(const iDynTree::MatrixDynSize& A, const iDynTree::MatrixDynSize& B, const iDynTree::MatrixDynSize& C, const iDynTree::MatrixDynSize& D)
{
    if (A.rows() != A.cols())
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "constructKalmanFilter", "Could not construct KF - ill-formed state transition matrix A, exiting.");
        return false;
    }
    m_dim_X = A.rows();
    m_A.resize(m_dim_X, m_dim_X);
    m_A = A;
    m_P.resize(m_dim_X, m_dim_X);
    m_P.zero();
    m_Q.resize(m_dim_X, m_dim_X);
    m_Q.zero();

    if (B.capacity() ==  0)
    {
        m_use_control_input = false;
    }
    else if (B.rows() != A.rows())
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "constructKalmanFilter", "Could not construct KF -  control input matrix B dimension mismatch, exiting.");
        return false;
    }
    else
    {
        m_use_control_input = true;
        m_B = B;
    }

    m_dim_U = m_B.cols();
    m_u.resize(m_dim_U);
    m_u.zero();

    if (C.capacity() == 0 || (C.cols() != A.rows()))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "constructKalmanFilter", "Could not construct KF -  output matrix C dimension mismatch, exiting.");
        return false;
    }
    m_dim_Y = C.rows();
    m_C = C;
    m_y.resize(m_dim_Y);
    m_y.zero();
    m_R.resize(m_dim_Y, m_dim_Y);
    m_R.zero();

    if (D.capacity() ==  0)
    {
        m_use_feed_through = false;
    }
    else if ((D.rows() != C.rows()) || (D.cols() != B.rows()))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "constructKalmanFilter", "Could not construct KF -  control feedthrough matrix D dimension mismatch, exiting.");
        return false;
    }
    else
    {
        m_use_feed_through = true;
        m_D = D;
    }

    m_filter_constructed = true;
    return true;
}